

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O1

QString * qt_ACE_do(QString *__return_storage_ptr__,QString *domain,AceOperation op,
                   AceLeadingDot dot,AceProcessingOptions options)

{
  ushort uVar1;
  char16_t cVar2;
  char16_t cVar3;
  Data *pDVar4;
  qsizetype qVar5;
  bool bVar6;
  char cVar7;
  IdnaStatus IVar8;
  char32_t cVar9;
  QArrayData *pQVar10;
  long lVar11;
  QArrayData *alloc;
  char16_t *pcVar12;
  int iVar13;
  byte bVar14;
  QArrayData *pQVar15;
  char16_t *pcVar16;
  char16_t *pcVar17;
  undefined1 *puVar18;
  uint uVar19;
  QString *__range1;
  char32_t ucs4;
  QString *pQVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  bool bVar22;
  bool bVar23;
  QLatin1StringView needle;
  QStringView label;
  QStringView haystack;
  QStringView aceDomain;
  QStringView QVar24;
  DomainValidityChecker checker;
  QString local_e8;
  QString local_c8;
  QString local_a8;
  QString local_88;
  QStringView local_68;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar10 = (QArrayData *)(domain->d).size;
  if (pQVar10 == (QArrayData *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_00266d13;
  }
  local_a8.d.ptr = (domain->d).ptr;
  iVar13 = 0;
  lVar11 = 0;
  do {
    uVar1 = *(ushort *)((long)local_a8.d.ptr + lVar11);
    bVar14 = 1;
    if (uVar1 < 0x80) {
      bVar22 = true;
      if (((uVar1 != 0x2d) && (uVar1 != 0x5f)) && (9 < (ushort)(uVar1 - 0x30))) {
        bVar22 = (ushort)(uVar1 - 0x61) < 0x1a;
      }
      bVar14 = uVar1 == 0x2e | bVar22;
      iVar13 = iVar13 + (uint)bVar14;
      bVar14 = bVar14 ^ 1;
    }
  } while ((bVar14 == 0) && (bVar22 = (long)pQVar10 * 2 + -2 != lVar11, lVar11 = lVar11 + 2, bVar22)
          );
  pQVar15 = (QArrayData *)(long)iVar13;
  if (pQVar10 == pQVar15) {
    local_a8.d.d = (domain->d).d;
    bVar22 = true;
    local_a8.d.size = (qsizetype)pQVar10;
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_a8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_a8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    local_a8.d.size = 0;
    alloc = (QArrayData *)0x0;
    if (0 < (long)pQVar10) {
      alloc = pQVar10;
    }
    QString::reallocData(&local_a8,(qsizetype)alloc,KeepSize);
    if ((&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) &&
       (*(qsizetype *)((long)local_a8.d.d + 8) != 0)) {
      *(byte *)&(((ArrayOptions *)((long)local_a8.d.d + 4))->
                super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(((ArrayOptions *)((long)local_a8.d.d + 4))->
                 super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    pcVar12 = (domain->d).ptr;
    if ((QChar *)pcVar12 == (QChar *)0x0) {
      pcVar12 = L"";
    }
    QString::append(&local_a8,(QChar *)pcVar12,(qsizetype)pQVar15);
    lVar11 = (domain->d).size - (long)pQVar15;
    if (lVar11 < 1) {
      bVar22 = true;
    }
    else {
      pcVar16 = (domain->d).ptr + (long)pQVar15;
      bVar22 = true;
      pcVar12 = pcVar16;
      do {
        pcVar17 = pcVar12 + 1;
        cVar2 = *pcVar12;
        if ((cVar2 & 0xf800U) == 0xd800) {
          uVar21 = 0xfffd;
          if ((((cVar2 & 0xdc00U) == 0xd800) && (pcVar17 < pcVar16 + lVar11)) &&
             (cVar3 = *pcVar17, (cVar3 & 0xfc00U) == 0xdc00)) {
            pcVar17 = pcVar12 + 2;
            uVar21 = (ulong)((uint)(ushort)cVar2 * 0x400 + (uint)(ushort)cVar3 + 0xfca02400);
          }
        }
        else {
          uVar21 = (ulong)(ushort)cVar2;
        }
        uVar19 = (uint)uVar21;
        if (uVar19 < 0x80) {
          if (uVar19 - 0x41 < 0x1a) {
            uVar21 = (ulong)(uVar19 | 0x20);
          }
          bVar6 = true;
          iVar13 = (int)uVar21;
          if (((iVar13 != 0x2d) && (iVar13 != 0x5f)) && (9 < iVar13 - 0x30U)) {
            bVar6 = iVar13 - 0x61U < 0x1a;
          }
          if ((bool)(iVar13 != 0x2e & (bVar6 ^ 1U))) goto LAB_00266458;
          QString::append(&local_a8,(QChar)(char16_t)uVar21);
        }
        else {
LAB_00266458:
          ucs4 = (char32_t)uVar21;
          if (ucs4 == L'ẞ' &&
              ((uint)options.super_QFlagsStorageHelper<QUrl::AceProcessingOption,_4>.
                     super_QFlagsStorage<QUrl::AceProcessingOption>.i & 2) != 0) {
            local_58.d.d = (Data *)0x0;
            local_58.d.ptr = L"ss";
            local_58.d.size = 2;
            QString::append(&local_a8,&local_58);
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          else {
            IVar8 = QUnicodeTables::idnaStatus(ucs4);
            if (IVar8 == Deviation) {
              IVar8 = ((uint)options.super_QFlagsStorageHelper<QUrl::AceProcessingOption,_4>.
                             super_QFlagsStorage<QUrl::AceProcessingOption>.i & 2) + Valid;
            }
            bVar22 = false;
            uVar19 = 0;
            if (IVar8 < Ignored) {
              cVar9 = ucs4;
              if (0xffff < (uint)ucs4) {
                cVar9 = (int)(uVar21 >> 10) + L'ퟀ';
                uVar19 = (ucs4 & 0x3ffU) << 0x10 | 0xdc000000;
              }
              local_58.d.d = (Data *)CONCAT44(local_58.d.d._4_4_,cVar9 & 0xffffU | uVar19);
              pDVar4 = local_58.d.d;
              local_58.d.d._2_2_ = (short)(uVar19 >> 0x10);
              puVar18 = (undefined1 *)((long)&local_58.d.d + 4);
              if (local_58.d.d._2_2_ == 0) {
                puVar18 = (undefined1 *)((long)&local_58.d.d + 2);
              }
              pQVar20 = &local_58;
              local_58.d.d = pDVar4;
              do {
                QString::append(&local_a8,(QChar)*(char16_t *)&(pQVar20->d).d);
                pQVar20 = (QString *)((long)&(pQVar20->d).d + 2);
              } while (pQVar20 != (QString *)puVar18);
            }
            else {
              if (IVar8 == Ignored) goto LAB_00266584;
              QVar24 = QUnicodeTables::idnaMapping(ucs4);
              QString::append(&local_a8,(QChar *)QVar24.m_data,QVar24.m_size);
            }
          }
          bVar22 = false;
        }
LAB_00266584:
        pcVar12 = pcVar17;
      } while (pcVar17 < pcVar16 + lVar11);
    }
  }
  local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if (bVar22) {
    local_c8.d.d = local_a8.d.d;
    local_c8.d.ptr = local_a8.d.ptr;
    local_c8.d.size = local_a8.d.size;
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    QString::normalized(&local_c8,&local_a8,NormalizationForm_C,Unicode_Unassigned);
  }
  if ((QArrayData *)local_c8.d.size == (QArrayData *)0x0) {
LAB_00266784:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    if (!bVar22) {
      local_88.d.d = (Data *)CONCAT53(local_88.d.d._3_5_,0x10000);
      puVar18 = (undefined1 *)0x0;
      do {
        pQVar10 = (QArrayData *)
                  QString::indexOf(&local_c8,(QChar)0x2e,(qsizetype)puVar18,CaseSensitive);
        if (pQVar10 == (QArrayData *)0xffffffffffffffff) {
          pQVar10 = (QArrayData *)local_c8.d.size;
        }
        if ((long)pQVar10 - (long)puVar18 == 0) {
LAB_0026671c:
          if (pQVar10 != (QArrayData *)local_c8.d.size) {
            puVar18 = (undefined1 *)
                      ((long)&(pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1);
          }
          cVar7 = (pQVar10 == (QArrayData *)local_c8.d.size) * '\x03';
        }
        else {
          local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QString::QString(&local_58,(QChar *)(local_c8.d.ptr + (long)puVar18),
                           (long)pQVar10 - (long)puVar18);
          bVar6 = anon_unknown.dwarf_54185d::DomainValidityChecker::checkLabel
                            ((DomainValidityChecker *)&local_88,&local_58,options);
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
          cVar7 = '\x01';
          if (bVar6) goto LAB_0026671c;
        }
      } while (cVar7 == '\0');
      if (cVar7 != '\x03') goto LAB_00266784;
    }
    local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    if (bVar22) {
      local_e8.d.d = local_c8.d.d;
      local_e8.d.ptr = local_c8.d.ptr;
      local_e8.d.size = local_c8.d.size;
      if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_68.m_size = local_c8.d.size;
      local_68.m_data = local_c8.d.ptr;
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char16_t *)0x0;
      pQVar10 = (QArrayData *)0x0;
      local_58.d.size = 0;
      local_88.d.d = (Data *)0x0;
      local_88.d.ptr = (char16_t *)0x0;
      local_88.d.size = 0;
      do {
        pQVar15 = (QArrayData *)
                  QStringView::indexOf(&local_68,(QChar)0x2e,(qsizetype)pQVar10,CaseSensitive);
        pDVar4 = local_58.d.d;
        if (pQVar15 == (QArrayData *)0xffffffffffffffff) {
          pQVar15 = (QArrayData *)local_68.m_size;
        }
        if ((long)pQVar15 - (long)pQVar10 == 0) {
LAB_0026689f:
          iVar13 = 3;
          if (pQVar15 != (QArrayData *)local_68.m_size) {
            if ((pQVar15 == pQVar10) && (dot == ForbidLeadingDot || 0 < (long)pQVar15))
            goto LAB_002668d6;
            QString::append(&local_88,(QChar)0x2e);
            pQVar10 = (QArrayData *)
                      ((long)&(pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + 1);
            iVar13 = 0;
          }
        }
        else {
          pcVar12 = local_68.m_data + (long)pQVar10;
          if (local_58.d.ptr != (char16_t *)0x0) {
            local_58.d.d = (Data *)0x0;
            local_58.d.ptr = (char16_t *)0x0;
            local_58.d.size = 0;
            if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
              }
            }
          }
          QVar24.m_data = pcVar12;
          QVar24.m_size = (long)pQVar15 - (long)pQVar10;
          qt_punycodeEncoder(QVar24,&local_58);
          if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
            QString::append(&local_88,&local_58);
            goto LAB_0026689f;
          }
LAB_002668d6:
          local_e8.d.size = 0;
          local_e8.d.ptr = (char16_t *)0x0;
          local_e8.d.d = (Data *)0x0;
          iVar13 = 1;
        }
        qVar5 = local_88.d.size;
        pcVar12 = local_88.d.ptr;
        pDVar4 = local_88.d.d;
      } while (iVar13 == 0);
      if (iVar13 == 3) {
        local_88.d.d = (Data *)0x0;
        local_88.d.ptr = (char16_t *)0x0;
        local_e8.d.d = pDVar4;
        local_e8.d.ptr = pcVar12;
        local_88.d.size = 0;
        local_e8.d.size = qVar5;
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((QArrayData *)local_e8.d.size == (QArrayData *)0x0) {
LAB_00266aca:
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      local_58.d.d = (Data *)local_e8.d.size;
      local_58.d.ptr = local_e8.d.ptr;
      bVar22 = false;
      puVar18 = (undefined1 *)0x0;
      do {
        if ((long)local_58.d.d <= (long)puVar18) goto LAB_00266a7b;
        pQVar10 = (QArrayData *)
                  QStringView::indexOf
                            ((QStringView *)&local_58,(QChar)0x2e,(qsizetype)puVar18,CaseSensitive);
        if (pQVar10 == (QArrayData *)0xffffffffffffffff) {
          pQVar10 = &(local_58.d.d)->super_QArrayData;
        }
        lVar11 = (long)pQVar10 - (long)puVar18;
        if (lVar11 == 0) {
          iVar13 = 3;
          if (((pQVar10 != &(local_58.d.d)->super_QArrayData) &&
              (iVar13 = 1, dot != ForbidLeadingDot)) && ((long)pQVar10 < 1)) {
LAB_00266a66:
            puVar18 = (undefined1 *)
                      ((long)&(pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1);
            iVar13 = 0;
          }
        }
        else {
          pcVar12 = local_58.d.ptr + (long)puVar18;
          label.m_data = pcVar12;
          label.m_size = lVar11;
          bVar6 = validateAsciiLabel(label);
          if ((bVar6) && (bVar23 = bVar22 == false, bVar22 = true, bVar23)) {
            needle.m_data = "xn--";
            needle.m_size = 4;
            haystack.m_data = pcVar12;
            haystack.m_size = lVar11;
            bVar22 = QtPrivate::startsWith(haystack,needle,CaseSensitive);
          }
          iVar13 = 1;
          if (bVar6) goto LAB_00266a66;
        }
      } while (iVar13 == 0);
      if (iVar13 == 3) {
LAB_00266a7b:
        bVar14 = bVar22 ^ 1;
        bVar22 = true;
      }
      else {
        bVar14 = 1;
        bVar22 = false;
      }
      if (!bVar22) goto LAB_00266aca;
      if ((op == ToAceOnly || bVar14 != 0) ||
         ((((uint)options.super_QFlagsStorageHelper<QUrl::AceProcessingOption,_4>.
                  super_QFlagsStorage<QUrl::AceProcessingOption>.i & 1) == 0 &&
          (aceDomain.m_data = local_e8.d.ptr, aceDomain.m_size = local_e8.d.size,
          bVar22 = qt_is_idn_enabled(aceDomain), !bVar22)))) {
        (__return_storage_ptr__->d).d = local_e8.d.d;
        (__return_storage_ptr__->d).ptr = local_e8.d.ptr;
        (__return_storage_ptr__->d).size = local_e8.d.size;
        if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        convertToUnicode(__return_storage_ptr__,&local_e8,options);
      }
    }
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00266d13:
  __stack_chk_fail();
}

Assistant:

QString qt_ACE_do(const QString &domain, AceOperation op, AceLeadingDot dot,
                  QUrl::AceProcessingOptions options)
{
    if (domain.isEmpty())
        return {};

    bool mappedToAscii;
    const QString mapped = mapDomainName(domain, options, &mappedToAscii);
    const QString normalized =
            mappedToAscii ? mapped : mapped.normalized(QString::NormalizationForm_C);

    if (normalized.isEmpty())
        return {};

    if (!mappedToAscii && !checkUnicodeName(normalized, options))
        return {};

    bool needsConversionToUnicode;
    const QString aceResult = mappedToAscii ? normalized : convertToAscii(normalized, dot);
    if (aceResult.isEmpty() || !checkAsciiDomainName(aceResult, dot, &needsConversionToUnicode))
        return {};

    if (op == ToAceOnly || !needsConversionToUnicode
        || (!options.testFlag(QUrl::IgnoreIDNWhitelist) && !qt_is_idn_enabled(aceResult))) {
        return aceResult;
    }

    return convertToUnicode(aceResult, options);
}